

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::PrivateToLocalPass::UpdateUse
          (PrivateToLocalPass *this,Instruction *inst,Instruction *user)

{
  bool bVar1;
  CommonDebugInfoInstructions CVar2;
  Op OVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  DebugInfoManager *this_00;
  uint32_t new_type_id;
  Instruction *user_local;
  Instruction *inst_local;
  PrivateToLocalPass *this_local;
  
  CVar2 = opt::Instruction::GetCommonDebugOpcode(inst);
  if (CVar2 == CommonDebugInfoDebugGlobalVariable) {
    pIVar5 = Pass::context(&this->super_Pass);
    this_00 = IRContext::get_debug_info_mgr(pIVar5);
    analysis::DebugInfoManager::ConvertDebugGlobalToLocalVariable(this_00,inst,user);
    return true;
  }
  OVar3 = opt::Instruction::opcode(inst);
  if (((OVar3 != OpName) && (OVar3 != OpEntryPoint)) && (2 < OVar3 - OpImageTexelPointer)) {
    if (OVar3 == OpAccessChain) {
      pIVar5 = Pass::context(&this->super_Pass);
      IRContext::ForgetUses(pIVar5,inst);
      uVar4 = opt::Instruction::type_id(inst);
      uVar4 = GetNewType(this,uVar4);
      if (uVar4 == 0) {
        return false;
      }
      opt::Instruction::SetResultType(inst,uVar4);
      pIVar5 = Pass::context(&this->super_Pass);
      IRContext::AnalyzeUses(pIVar5,inst);
      bVar1 = UpdateUses(this,inst);
      if (!bVar1) {
        return false;
      }
    }
    else {
      OVar3 = opt::Instruction::opcode(inst);
      bVar1 = spvOpcodeIsDecoration(OVar3);
      if (!bVar1) {
        __assert_fail("spvOpcodeIsDecoration(inst->opcode()) && \"Do not know how to update the type for this instruction.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp"
                      ,0xd7,
                      "bool spvtools::opt::PrivateToLocalPass::UpdateUse(Instruction *, Instruction *)"
                     );
      }
    }
  }
  return true;
}

Assistant:

bool PrivateToLocalPass::UpdateUse(Instruction* inst, Instruction* user) {
  // The cases in this switch have to match the cases in |IsValidUse|.  If we
  // don't think it is valid, the optimization will not view the variable as a
  // candidate, and therefore the use will not be updated.
  if (inst->GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
    context()->get_debug_info_mgr()->ConvertDebugGlobalToLocalVariable(inst,
                                                                       user);
    return true;
  }
  switch (inst->opcode()) {
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpImageTexelPointer:  // Treat like a load
      // The type is fine because it is the type pointed to, and that does not
      // change.
      break;
    case spv::Op::OpAccessChain: {
      context()->ForgetUses(inst);
      uint32_t new_type_id = GetNewType(inst->type_id());
      if (new_type_id == 0) {
        return false;
      }
      inst->SetResultType(new_type_id);
      context()->AnalyzeUses(inst);

      // Update uses where the type may have changed.
      if (!UpdateUses(inst)) {
        return false;
      }
    } break;
    case spv::Op::OpName:
    case spv::Op::OpEntryPoint:  // entry points will be updated separately.
      break;
    default:
      assert(spvOpcodeIsDecoration(inst->opcode()) &&
             "Do not know how to update the type for this instruction.");
      break;
  }
  return true;
}